

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Runner::testEnded(Runner *this,AssertionResult *result)

{
  size_t *psVar1;
  OfType OVar2;
  pointer ppSVar3;
  IReporter *pIVar4;
  pointer pAVar5;
  pointer ppSVar6;
  pointer pAVar7;
  pointer this_00;
  AssertionResult local_e8;
  
  OVar2 = (result->m_resultData).resultType;
  if (OVar2 == Ok) {
    (this->m_totals).assertions.passed = (this->m_totals).assertions.passed + 1;
  }
  else if (((OVar2 & FailureBit) != Ok) &&
          (((result->m_info).resultDisposition & SuppressFail) == Normal)) {
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 + 1;
    ppSVar6 = (this->m_scopedInfos).
              super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar3 = (this->m_scopedInfos).
              super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppSVar6 != ppSVar3) {
      do {
        pIVar4 = (this->m_reporter).m_p;
        ExpressionResultBuilder::buildResult
                  (&local_e8,(ExpressionResultBuilder *)*ppSVar6,&this->m_lastAssertionInfo);
        (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar4,&local_e8);
        AssertionResult::~AssertionResult(&local_e8);
        ppSVar6 = ppSVar6 + 1;
      } while (ppSVar6 != ppSVar3);
    }
    pAVar5 = (this->m_assertionResults).
             super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pAVar7 = (this->m_assertionResults).
                  super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar5; pAVar7 = pAVar7 + 1)
    {
      pIVar4 = (this->m_reporter).m_p;
      (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar4,pAVar7);
    }
    pAVar7 = (this->m_assertionResults).
             super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar5 = (this->m_assertionResults).
             super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = pAVar7;
    if (pAVar5 != pAVar7) {
      do {
        AssertionResult::~AssertionResult(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pAVar5);
      (this->m_assertionResults).
      super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>._M_impl.
      super__Vector_impl_data._M_finish = pAVar7;
    }
  }
  if ((result->m_resultData).resultType == Info) {
    std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::push_back
              (&this->m_assertionResults,result);
  }
  else {
    pIVar4 = (this->m_reporter).m_p;
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar4,result);
  }
  return;
}

Assistant:

virtual void testEnded( const AssertionResult& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;

                {
                    std::vector<ScopedInfo*>::const_iterator it = m_scopedInfos.begin();
                    std::vector<ScopedInfo*>::const_iterator itEnd = m_scopedInfos.end();
                    for(; it != itEnd; ++it )
                        m_reporter->Result( (*it)->buildResult( m_lastAssertionInfo ) );
                }
                {
                    std::vector<AssertionResult>::const_iterator it = m_assertionResults.begin();
                    std::vector<AssertionResult>::const_iterator itEnd = m_assertionResults.end();
                    for(; it != itEnd; ++it )
                        m_reporter->Result( *it );
                }
                m_assertionResults.clear();
            }

            if( result.getResultType() == ResultWas::Info )
                m_assertionResults.push_back( result );
            else
                m_reporter->Result( result );
        }